

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

bool __thiscall pbrt::BilinearPatch::IsRectangle(BilinearPatch *this)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fStack_34;
  float afStack_30 [4];
  
  lVar7 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar12 = (long)this->blpIndex * 0x10;
  lVar11 = *(long *)(lVar7 + 0x10);
  lVar7 = *(long *)(lVar7 + 0x18);
  pfVar1 = (float *)(lVar7 + (long)*(int *)(lVar11 + lVar12) * 0xc);
  pfVar2 = (float *)(lVar7 + (long)*(int *)(lVar11 + 8 + lVar12) * 0xc);
  fVar16 = *pfVar1;
  fVar5 = *pfVar2;
  if ((fVar16 == fVar5) && (!NAN(fVar16) && !NAN(fVar5))) {
    if ((pfVar1[1] == pfVar2[1]) && (!NAN(pfVar1[1]) && !NAN(pfVar2[1]))) {
      if ((pfVar1[2] == pfVar2[2]) && (!NAN(pfVar1[2]) && !NAN(pfVar2[2]))) {
        return false;
      }
    }
  }
  pfVar3 = (float *)(lVar7 + (long)*(int *)(lVar11 + 0xc + lVar12) * 0xc);
  fVar6 = *pfVar3;
  if ((fVar5 == fVar6) && (!NAN(fVar5) && !NAN(fVar6))) {
    if ((pfVar2[1] == pfVar3[1]) && (!NAN(pfVar2[1]) && !NAN(pfVar3[1]))) {
      if ((pfVar2[2] == pfVar3[2]) && (!NAN(pfVar2[2]) && !NAN(pfVar3[2]))) {
        return false;
      }
    }
  }
  pfVar4 = (float *)(lVar7 + (long)*(int *)(lVar11 + 4 + lVar12) * 0xc);
  fVar14 = *pfVar4;
  if ((fVar6 == fVar14) && (!NAN(fVar6) && !NAN(fVar14))) {
    if ((pfVar3[1] == pfVar4[1]) && (!NAN(pfVar3[1]) && !NAN(pfVar4[1]))) {
      if ((pfVar3[2] == pfVar4[2]) && (!NAN(pfVar3[2]) && !NAN(pfVar4[2]))) {
        return false;
      }
    }
  }
  if ((fVar14 == fVar16) && (!NAN(fVar14) && !NAN(fVar16))) {
    if ((pfVar4[1] == pfVar1[1]) && (!NAN(pfVar4[1]) && !NAN(pfVar1[1]))) {
      if ((pfVar4[2] == pfVar1[2]) && (!NAN(pfVar4[2]) && !NAN(pfVar1[2]))) {
        return false;
      }
    }
  }
  fVar14 = fVar14 - fVar16;
  fVar8 = pfVar4[1] - pfVar1[1];
  fVar6 = pfVar4[2] - pfVar1[2];
  fVar5 = fVar5 - fVar16;
  fVar9 = pfVar2[1] - pfVar1[1];
  fVar10 = pfVar2[2] - pfVar1[2];
  auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar8),
                            ZEXT416((uint)(fVar6 * fVar9)));
  auVar22 = vfnmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar9)),ZEXT416((uint)fVar6),
                             ZEXT416((uint)fVar9));
  fVar16 = auVar13._0_4_ + auVar22._0_4_;
  auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar5),
                            ZEXT416((uint)(fVar14 * fVar10)));
  auVar22 = vfnmadd213ss_fma(ZEXT416((uint)fVar10),ZEXT416((uint)fVar14),
                             ZEXT416((uint)(fVar14 * fVar10)));
  fVar6 = auVar13._0_4_ + auVar22._0_4_;
  auVar13 = vfmsub213ss_fma(ZEXT416((uint)fVar9),ZEXT416((uint)fVar14),
                            ZEXT416((uint)(fVar5 * fVar8)));
  auVar22 = vfnmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)fVar8),
                             ZEXT416((uint)(fVar5 * fVar8)));
  fVar5 = auVar22._0_4_ + auVar13._0_4_;
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar6 * fVar6)),ZEXT416((uint)fVar16),
                            ZEXT416((uint)fVar16));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar5),ZEXT416((uint)fVar5));
  if (auVar13._0_4_ < 0.0) {
    fVar14 = sqrtf(auVar13._0_4_);
  }
  else {
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    fVar14 = auVar13._0_4_;
  }
  fVar8 = *pfVar3 - *pfVar1;
  fVar9 = pfVar3[1] - pfVar1[1];
  fVar10 = pfVar3[2] - pfVar1[2];
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * fVar9)),ZEXT416((uint)fVar8),ZEXT416((uint)fVar8)
                           );
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
  if (auVar13._0_4_ < 0.0) {
    fVar15 = sqrtf(auVar13._0_4_);
  }
  else {
    auVar13 = vsqrtss_avx(auVar13,auVar13);
    fVar15 = auVar13._0_4_;
  }
  auVar22 = ZEXT416((uint)((fVar5 / fVar14) * (fVar10 / fVar15)));
  auVar13 = vfmadd213ss_fma(ZEXT416((uint)(fVar9 / fVar15)),ZEXT416((uint)(fVar6 / fVar14)),auVar22)
  ;
  auVar22 = vfmsub213ss_fma(ZEXT416((uint)(fVar10 / fVar15)),ZEXT416((uint)(fVar5 / fVar14)),auVar22
                           );
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar22._0_4_)),
                            ZEXT416((uint)(fVar16 / fVar14)),ZEXT416((uint)(fVar8 / fVar15)));
  auVar22._8_4_ = 0x7fffffff;
  auVar22._0_8_ = 0x7fffffff7fffffff;
  auVar22._12_4_ = 0x7fffffff;
  auVar13 = vandps_avx512vl(auVar13,auVar22);
  if (auVar13._0_4_ <= 1e-05) {
    fVar16 = (*pfVar3 + *pfVar4 + *pfVar1 + *pfVar2) * 0.25;
    fVar5 = (pfVar3[1] + pfVar4[1] + pfVar1[1] + pfVar2[1]) * 0.25;
    fVar6 = (pfVar1[2] + pfVar2[2] + pfVar4[2] + pfVar3[2]) * 0.25;
    auVar13 = vinsertps_avx(ZEXT416((uint)*pfVar1),ZEXT416((uint)*pfVar2),0x10);
    auVar21._4_4_ = fVar16;
    auVar21._0_4_ = fVar16;
    auVar21._8_4_ = fVar16;
    auVar21._12_4_ = fVar16;
    auVar22 = vsubps_avx(auVar13,auVar21);
    auVar13 = vinsertps_avx(ZEXT416((uint)pfVar1[1]),ZEXT416((uint)pfVar2[1]),0x10);
    auVar18._4_4_ = fVar5;
    auVar18._0_4_ = fVar5;
    auVar18._8_4_ = fVar5;
    auVar18._12_4_ = fVar5;
    auVar20 = vsubps_avx(auVar13,auVar18);
    auVar13 = vinsertps_avx(ZEXT416((uint)pfVar1[2]),ZEXT416((uint)pfVar2[2]),0x10);
    auVar23._4_4_ = fVar6;
    auVar23._0_4_ = fVar6;
    auVar23._8_4_ = fVar6;
    auVar23._12_4_ = fVar6;
    auVar13 = vsubps_avx(auVar13,auVar23);
    auVar17._0_4_ = auVar20._0_4_ * auVar20._0_4_;
    auVar17._4_4_ = auVar20._4_4_ * auVar20._4_4_;
    auVar17._8_4_ = auVar20._8_4_ * auVar20._8_4_;
    auVar17._12_4_ = auVar20._12_4_ * auVar20._12_4_;
    auVar22 = vfmadd231ps_fma(auVar17,auVar22,auVar22);
    auVar17 = vfmadd231ps_fma(auVar22,auVar13,auVar13);
    auVar13 = vinsertps_avx(ZEXT416((uint)*pfVar4),ZEXT416((uint)*pfVar3),0x10);
    auVar22 = vsubps_avx(auVar13,auVar21);
    auVar13 = vinsertps_avx(ZEXT416((uint)pfVar4[1]),ZEXT416((uint)pfVar3[1]),0x10);
    auVar20 = vsubps_avx(auVar13,auVar18);
    auVar13 = vinsertps_avx(ZEXT416((uint)pfVar4[2]),ZEXT416((uint)pfVar3[2]),0x10);
    auVar13 = vsubps_avx(auVar13,auVar23);
    auVar19._0_4_ = auVar20._0_4_ * auVar20._0_4_;
    auVar19._4_4_ = auVar20._4_4_ * auVar20._4_4_;
    auVar19._8_4_ = auVar20._8_4_ * auVar20._8_4_;
    auVar19._12_4_ = auVar20._12_4_ * auVar20._12_4_;
    auVar22 = vfmadd231ps_fma(auVar19,auVar22,auVar22);
    auVar13 = vfmadd231ps_fma(auVar22,auVar13,auVar13);
    auVar13 = vmovlhps_avx(auVar17,auVar13);
    fStack_34 = auVar13._4_4_;
    fVar16 = auVar17._0_4_;
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)(fStack_34 - fVar16)),auVar13);
    if (auVar13._0_4_ / fVar16 <= 0.0001) {
      auVar20._8_4_ = 0x7fffffff;
      auVar20._0_8_ = 0x7fffffff7fffffff;
      auVar20._12_4_ = 0x7fffffff;
      lVar7 = 0;
      do {
        lVar11 = lVar7;
        if (lVar11 == 2) break;
        auVar13 = vandps_avx(ZEXT416((uint)(afStack_30[lVar11] - fVar16)),auVar20);
        lVar7 = lVar11 + 1;
      } while (auVar13._0_4_ / fVar16 <= 0.0001);
      return 2 < lVar11 + 1U;
    }
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    const BilinearPatchMesh *GetMesh() const {
#ifdef PBRT_IS_GPU_CODE
        return (*allBilinearMeshesGPU)[meshIndex];
#else
        return (*allMeshes)[meshIndex];
#endif
    }